

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O2

void __thiscall XmlOutput::addDeclaration(XmlOutput *this,QString *version,QString *encoding)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->currentState - Tag < 2) {
    local_58.d._0_4_ = 2;
    local_58.size._4_4_ = 0;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_40 = "default";
    QList<QString>::end(&(this->tagStack).super_QList<QString>);
    QString::toLatin1_helper((QString *)&local_70);
    if (local_70.ptr == (char16_t *)0x0) {
      local_70.ptr = (char16_t *)&QByteArray::_empty;
    }
    QMessageLogger::debug
              ((char *)&local_58,"<%s>: Cannot add declaration when not in bare state",local_70.ptr)
    ;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
  }
  else {
    local_58.size._0_4_ = 0xaaaaaaaa;
    local_58.size._4_4_ = 0xaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    QString::QString((QString *)&local_88,"<?xml version=\"%1\" encoding=\"%2\"?>");
    doConversion((QString *)&local_a0,this,version);
    QString::arg<QString,_true>
              ((QString *)&local_70,(QString *)&local_88,(QString *)&local_a0,0,(QChar)0x20);
    doConversion((QString *)&QStack_b8,this,encoding);
    QString::arg<QString,_true>
              ((QString *)&local_58,(QString *)&local_70,(QString *)&QStack_b8,0,(QChar)0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    addRaw(this,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::addDeclaration(const QString &version, const QString &encoding)
{
    switch(currentState) {
        case Bare:
            break;
        case Tag:
        case Attribute:
            //warn_msg(WarnLogic, "<%s>: Cannot add declaration when not in bare state", tagStack.last().toLatin1().constData());
            qDebug("<%s>: Cannot add declaration when not in bare state", tagStack.last().toLatin1().constData());
            return;
    }
    QString outData = QString("<?xml version=\"%1\" encoding=\"%2\"?>")
                              .arg(doConversion(version))
                              .arg(doConversion(encoding));
    addRaw(outData);
}